

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

void death_knowledge(player *p)

{
  object *poVar1;
  uint uVar2;
  time_t local_28;
  time_t death_time;
  object *obj;
  store *home;
  player *p_local;
  
  home = (store *)p;
  obj = (object *)store_home(p);
  local_28 = 0;
  if ((short)home[2].sidx != 0) {
    *(undefined2 *)&home->stock_num = 0;
    my_strcpy((char *)((long)&home[1].always_size + 2),"Ripe Old Age",0x50);
    *(undefined4 *)&home->always_size = *(undefined4 *)((long)&home->stock_k + 4);
    *(undefined2 *)((long)&home->stock_k + 2) = *(undefined2 *)&home->stock_k;
    *(int *)&home->town = *(int *)&home->town + 10000000;
  }
  player_learn_all_runes((player *)home);
  for (death_time = (time_t)home[3].buy; death_time != 0;
      death_time = *(time_t *)(death_time + 0x20)) {
    object_flavor_aware((player *)home,(object *)death_time);
    *(undefined8 *)(*(long *)(death_time + 0x28) + 0x100) = *(undefined8 *)(death_time + 0x100);
    *(undefined8 *)(*(long *)(death_time + 0x28) + 0x110) = *(undefined8 *)(death_time + 0x110);
  }
  if (obj != (object *)0x0) {
    for (death_time = *(time_t *)&(obj->grid).y; death_time != 0;
        death_time = *(time_t *)(death_time + 0x20)) {
      object_flavor_aware((player *)home,(object *)death_time);
      *(undefined8 *)(*(long *)(death_time + 0x28) + 0x100) = *(undefined8 *)(death_time + 0x100);
      *(undefined8 *)(*(long *)(death_time + 0x28) + 0x110) = *(undefined8 *)(death_time + 0x110);
    }
  }
  history_unmask_unknown((player *)home);
  time(&local_28);
  enter_score((player *)home,&local_28);
  poVar1 = home[8].stock_k;
  uVar2._0_1_ = poVar1->tval;
  uVar2._1_1_ = poVar1->sval;
  uVar2._2_2_ = poVar1->pval;
  uVar2 = uVar2 | 1;
  poVar1->tval = (char)uVar2;
  poVar1->sval = (char)(uVar2 >> 8);
  poVar1->pval = (short)(uVar2 >> 0x10);
  handle_stuff((player *)home);
  return;
}

Assistant:

void death_knowledge(struct player *p)
{
	struct store *home = store_home(p);
	struct object *obj;
	time_t death_time = (time_t)0;

	/* Retire in the town in a good state */
	if (p->total_winner) {
		p->depth = 0;
		my_strcpy(p->died_from, "Ripe Old Age", sizeof(p->died_from));
		p->exp = p->max_exp;
		p->lev = p->max_lev;
		p->au += 10000000L;
	}

	player_learn_all_runes(p);
	for (obj = p->gear; obj; obj = obj->next) {
		object_flavor_aware(p, obj);
		obj->known->effect = obj->effect;
		obj->known->activation = obj->activation;
	}

	/* Thralls may not have a home */
	if (home) {
		for (obj = home->stock; obj; obj = obj->next) {
			object_flavor_aware(p, obj);
			obj->known->effect = obj->effect;
			obj->known->activation = obj->activation;
		}
	}

	history_unmask_unknown(p);

	/* Get time of death */
	(void)time(&death_time);
	enter_score(p, &death_time);

	/* Hack -- Recalculate bonuses */
	p->upkeep->update |= (PU_BONUS);
	handle_stuff(p);
}